

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_FilePathUtils.cpp
# Opt level: O3

String * axl::io::getFileName(String *__return_storage_ptr__,StringRef *filePath)

{
  char *pcVar1;
  ulong uVar2;
  StringRef SStack_28;
  
  uVar2 = filePath->m_length;
  if (uVar2 != 0) {
    pcVar1 = filePath->m_p + uVar2;
    uVar2 = ~uVar2;
    do {
      pcVar1 = pcVar1 + -1;
      if (pcVar1 < filePath->m_p) goto LAB_001373a6;
      uVar2 = uVar2 + 1;
    } while (*pcVar1 != '/');
    if (uVar2 != 0) {
      sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::getSubString
                (&SStack_28,filePath,-uVar2,0xffffffffffffffff);
      goto LAB_001373ae;
    }
  }
LAB_001373a6:
  sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase(&SStack_28,filePath);
LAB_001373ae:
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::StringBase
            (__return_storage_ptr__,&SStack_28);
  sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&SStack_28);
  return __return_storage_ptr__;
}

Assistant:

sl::String
getFileName(const sl::StringRef& filePath) {
#if (_AXL_OS_WIN)
	char buffer[256];
	sl::String_w filePath_w(rc::BufKind_Stack, buffer, sizeof(buffer));
	filePath_w = filePath;

	wchar_t fileName[1024] = { 0 };
	wchar_t extension[1024] = { 0 };

	_wsplitpath_s(
		filePath_w,
		NULL, 0,
		NULL, 0,
		fileName, countof(fileName) - 1,
		extension, countof(extension) - 1
	);

	sl::String string = fileName;
	string.append(extension);
	return string;
#elif (_AXL_OS_POSIX)
	size_t i = filePath.reverseFind('/');
	return i != -1 ? filePath.getSubString(i + 1) : filePath;
#endif
}